

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

RegexMatcher * __thiscall
icu_63::RegexMatcher::region
          (RegexMatcher *this,int64_t regionStart,int64_t regionLimit,int64_t startIndex,
          UErrorCode *status)

{
  UBool UVar1;
  int64_t nativeLimit;
  int64_t nativeStart;
  UErrorCode *status_local;
  int64_t startIndex_local;
  int64_t regionLimit_local;
  int64_t regionStart_local;
  RegexMatcher *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (((regionLimit < regionStart) || (regionStart < 0)) || (regionLimit < 0)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    if ((this->fInputLength < regionStart) || (this->fInputLength < regionLimit)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    if (startIndex == -1) {
      reset(this);
    }
    else {
      resetPreserveRegion(this);
    }
    this->fRegionStart = regionStart;
    this->fRegionLimit = regionLimit;
    this->fActiveStart = regionStart;
    this->fActiveLimit = regionLimit;
    if (startIndex != -1) {
      if ((startIndex < this->fActiveStart) || (this->fActiveLimit < startIndex)) {
        *status = U_INDEX_OUTOFBOUNDS_ERROR;
      }
      this->fMatchEnd = startIndex;
    }
    if (this->fTransparentBounds == '\0') {
      this->fLookStart = regionStart;
      this->fLookLimit = regionLimit;
    }
    if (this->fAnchoringBounds != '\0') {
      this->fAnchorStart = regionStart;
      this->fAnchorLimit = regionLimit;
    }
  }
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::region(int64_t regionStart, int64_t regionLimit, int64_t startIndex, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return *this;
    }

    if (regionStart>regionLimit || regionStart<0 || regionLimit<0) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }

    int64_t nativeStart = regionStart;
    int64_t nativeLimit = regionLimit;
    if (nativeStart > fInputLength || nativeLimit > fInputLength) {
      status = U_ILLEGAL_ARGUMENT_ERROR;
    }

    if (startIndex == -1)
      this->reset();
    else
      resetPreserveRegion();

    fRegionStart = nativeStart;
    fRegionLimit = nativeLimit;
    fActiveStart = nativeStart;
    fActiveLimit = nativeLimit;

    if (startIndex != -1) {
      if (startIndex < fActiveStart || startIndex > fActiveLimit) {
          status = U_INDEX_OUTOFBOUNDS_ERROR;
      }
      fMatchEnd = startIndex;
    }

    if (!fTransparentBounds) {
        fLookStart = nativeStart;
        fLookLimit = nativeLimit;
    }
    if (fAnchoringBounds) {
        fAnchorStart = nativeStart;
        fAnchorLimit = nativeLimit;
    }
    return *this;
}